

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_write(htsFile *hfp,bcf_hdr_t *h,bcf1_t *v)

{
  htsExactFormat hVar1;
  BGZF *pBVar2;
  undefined8 uVar3;
  ulong totalbytes;
  char *__src;
  int iVar4;
  ssize_t sVar5;
  size_t sVar6;
  ulong __n;
  bcf1_t *v_00;
  ulong uVar7;
  htsFile *phVar8;
  uint32_t x [8];
  
  if (h->dirty == 0) {
    if (h->n[2] == (uint)(*(ulong *)&v->field_0x10 >> 0x28)) {
      hVar1 = (hfp->format).format;
      if ((hVar1 == vcf) || (hVar1 == text_format)) {
        iVar4 = vcf_write(hfp,h,v);
        return iVar4;
      }
      phVar8 = (htsFile *)(ulong)(uint)v->errcode;
      if (v->errcode != 0) goto LAB_001175cd;
      bcf1_sync(v);
      pBVar2 = (hfp->fp).bgzf;
      x[0] = (int)(v->shared).l + 0x18;
      x[1] = (uint32_t)(v->indiv).l;
      x[2] = v->rid;
      x[3] = v->pos;
      x[4] = v->rlen;
      x[5] = (uint32_t)v->qual;
      uVar3 = *(undefined8 *)&v->field_0x10;
      x[6] = (uint32_t)uVar3;
      x[7] = (uint)((ulong)uVar3 >> 0x28) | (uint)((ulong)uVar3 >> 8) & 0xff000000;
      sVar5 = bgzf_write(pBVar2,x,0x20);
      iVar4 = -1;
      if ((sVar5 == 0x20) &&
         (sVar6 = bgzf_write(pBVar2,(v->shared).s,(v->shared).l), sVar6 == (v->shared).l)) {
        sVar6 = bgzf_write(pBVar2,(v->indiv).s,(v->indiv).l);
        iVar4 = -(uint)(sVar6 != (v->indiv).l);
      }
    }
    else {
      fprintf(_stderr,
              "[%s:%d %s] Broken VCF record, the number of columns at %s:%d does not match the number of samples (%d vs %d).\n"
              ,
              "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
              ,0x48e,"bcf_write",h->id[1][v->rid].key,(ulong)(v->pos + 1),
              *(ulong *)&v->field_0x10 >> 0x28,(ulong)(uint)h->n[2]);
      iVar4 = -1;
    }
    return iVar4;
  }
  bcf_write_cold_1();
  phVar8 = hfp;
LAB_001175cd:
  bcf_write_cold_2();
  (phVar8->line).l = 0;
  vcf_format(h,v_00,&phVar8->line);
  pBVar2 = (BGZF *)(phVar8->fp).hfile;
  totalbytes = (phVar8->line).l;
  __src = (phVar8->line).s;
  if ((phVar8->format).compression == no_compression) {
    uVar7 = pBVar2->uncompressed_address - (long)*(void **)&pBVar2->block_length;
    __n = totalbytes;
    if (uVar7 < totalbytes) {
      __n = uVar7;
    }
    memcpy(*(void **)&pBVar2->block_length,__src,__n);
    *(ulong *)&pBVar2->block_length = *(long *)&pBVar2->block_length + __n;
    if (uVar7 < totalbytes) {
      __n = hwrite2((hFILE *)pBVar2,__src,totalbytes,__n);
    }
  }
  else {
    __n = bgzf_write(pBVar2,__src,totalbytes);
  }
  return -(uint)((long)(int)__n != (phVar8->line).l);
}

Assistant:

int bcf_write(htsFile *hfp, const bcf_hdr_t *h, bcf1_t *v)
{
    if ( h->dirty )
    {
        // we could as well call bcf_hdr_sync here, not sure
        fprintf(stderr,"FIXME: dirty header not synced\n");
        exit(1);
    }
    if ( bcf_hdr_nsamples(h)!=v->n_sample )
    {
        fprintf(stderr,"[%s:%d %s] Broken VCF record, the number of columns at %s:%d does not match the number of samples (%d vs %d).\n",
                __FILE__,__LINE__,__FUNCTION__,bcf_seqname(h,v),v->pos+1, v->n_sample,bcf_hdr_nsamples(h));
        return -1;
    }

    if ( hfp->format.format == vcf || hfp->format.format == text_format )
        return vcf_write(hfp,h,v);

    if ( v->errcode )
    {
        // vcf_parse1() encountered a new contig or tag, undeclared in the
        // header.  At this point, the header must have been printed,
        // proceeding would lead to a broken BCF file. Errors must be checked
        // and cleared by the caller before we can proceed.
        fprintf(stderr,"[%s:%d %s] Unchecked error (%d), exiting.\n", __FILE__,__LINE__,__FUNCTION__,v->errcode);
        exit(1);
    }
    bcf1_sync(v);   // check if the BCF record was modified

    BGZF *fp = hfp->fp.bgzf;
    uint32_t x[8];
    x[0] = v->shared.l + 24; // to include six 32-bit integers
    x[1] = v->indiv.l;
    memcpy(x + 2, v, 16);
    x[6] = (uint32_t)v->n_allele<<16 | v->n_info;
    x[7] = (uint32_t)v->n_fmt<<24 | v->n_sample;
    if ( bgzf_write(fp, x, 32) != 32 ) return -1;
    if ( bgzf_write(fp, v->shared.s, v->shared.l) != v->shared.l ) return -1;
    if ( bgzf_write(fp, v->indiv.s, v->indiv.l) != v->indiv.l ) return -1;
    return 0;
}